

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *F)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined4 *puVar5;
  double *pdVar6;
  long lVar7;
  char *pcVar8;
  Matrix3x3 *pMVar9;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *pDVar10
  ;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *pDVar11;
  byte bVar12;
  undefined8 local_258;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_248;
  MatrixDynSize dfq_by_dangvel;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_200;
  UnitQuaternion q;
  Matrix3x3 dfgyrobias_by_dgyrobias;
  Vector3 ang_vel;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
  local_158;
  Matrix3x3 dfangvel_by_dgyrobias;
  Vector3 gyro_bias;
  Matrix4x4 dfq_by_dq;
  
  bVar12 = 0;
  sVar4 = iDynTree::VectorDynSize::size();
  if (sVar4 == this->m_state_size) {
    sVar4 = iDynTree::MatrixDynSize::rows();
    if ((sVar4 == this->m_state_size) &&
       (sVar4 = iDynTree::MatrixDynSize::cols(), sVar4 == this->m_state_size)) {
      iDynTree::MatrixDynSize::zero();
      toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
              &dfangvel_by_dgyrobias,x);
      dfq_by_dq.m_data[0] = dfangvel_by_dgyrobias.m_data[0];
      dfq_by_dq.m_data[2] = dfangvel_by_dgyrobias.m_data[0];
      dfq_by_dq.m_data[3] = dfangvel_by_dgyrobias.m_data[1];
      dfq_by_dq.m_data[4] =
           (double)CONCAT71(dfq_by_dq.m_data[4]._1_7_,dfangvel_by_dgyrobias.m_data[2]._0_1_);
      dfq_by_dq.m_data[5] = 0.0;
      dfq_by_dq.m_data[7] = dfangvel_by_dgyrobias.m_data[1];
      dfgyrobias_by_dgyrobias.m_data[0] = (double)&q;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,4,1,false>>
                ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &dfgyrobias_by_dgyrobias,
                 (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
                  *)&dfq_by_dq);
      toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
              &dfangvel_by_dgyrobias,x);
      dfq_by_dq.m_data[0] = (double)((long)dfangvel_by_dgyrobias.m_data[0] + 0x20);
      dfq_by_dq.m_data[2] = dfangvel_by_dgyrobias.m_data[0];
      dfq_by_dq.m_data[3] = dfangvel_by_dgyrobias.m_data[1];
      dfq_by_dq.m_data[4] =
           (double)CONCAT71(dfq_by_dq.m_data[4]._1_7_,dfangvel_by_dgyrobias.m_data[2]._0_1_);
      dfq_by_dq.m_data[5] = 1.97626258336499e-323;
      dfq_by_dq.m_data[7] = dfangvel_by_dgyrobias.m_data[1];
      dfgyrobias_by_dgyrobias.m_data[0] = (double)&ang_vel;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &dfgyrobias_by_dgyrobias,
                 (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                  *)&dfq_by_dq);
      toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
              &dfangvel_by_dgyrobias,x);
      dfq_by_dq.m_data[0] = (double)((long)dfangvel_by_dgyrobias.m_data[0] + 0x38);
      dfq_by_dq.m_data[2] = dfangvel_by_dgyrobias.m_data[0];
      dfq_by_dq.m_data[3] = dfangvel_by_dgyrobias.m_data[1];
      dfq_by_dq.m_data[4] =
           (double)CONCAT71(dfq_by_dq.m_data[4]._1_7_,dfangvel_by_dgyrobias.m_data[2]._0_1_);
      dfq_by_dq.m_data[5] = 3.45845952088873e-323;
      dfq_by_dq.m_data[7] = dfangvel_by_dgyrobias.m_data[1];
      dfgyrobias_by_dgyrobias.m_data[0] = (double)&gyro_bias;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &dfgyrobias_by_dgyrobias,
                 (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                  *)&dfq_by_dq);
      dVar1 = (this->m_params_qekf).time_step_in_seconds;
      dfq_by_dq.m_data[0] = 2.0 / dVar1;
      dfq_by_dq.m_data[6] = ang_vel.m_data[2];
      dfq_by_dq.m_data[0xc] = ang_vel.m_data[2];
      dfq_by_dq.m_data[0xb] = ang_vel.m_data[0];
      dfq_by_dq.m_data[1] = -ang_vel.m_data[0];
      dfq_by_dq.m_data[2] = -ang_vel.m_data[1];
      dfq_by_dq.m_data[0xd] = ang_vel.m_data[1];
      dfq_by_dq.m_data[8] = ang_vel.m_data[1];
      dfq_by_dq.m_data[3] = -ang_vel.m_data[2];
      dfq_by_dq.m_data[4] = ang_vel.m_data[0];
      dfgyrobias_by_dgyrobias.m_data[0] = dVar1 * 0.5;
      dfangvel_by_dgyrobias.m_data[0] = (double)&dfq_by_dq;
      dfq_by_dq.m_data[5] = dfq_by_dq.m_data[0];
      dfq_by_dq.m_data[7] = dfq_by_dq.m_data[2];
      dfq_by_dq.m_data[9] = dfq_by_dq.m_data[3];
      dfq_by_dq.m_data[10] = dfq_by_dq.m_data[0];
      dfq_by_dq.m_data[0xe] = dfq_by_dq.m_data[1];
      dfq_by_dq.m_data[0xf] = dfq_by_dq.m_data[0];
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>::
      operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&dfangvel_by_dgyrobias,dfgyrobias_by_dgyrobias.m_data);
      iDynTree::MatrixDynSize::MatrixDynSize(&dfq_by_dangvel);
      iDynTree::MatrixDynSize::resize((ulong)&dfq_by_dangvel,4);
      dVar1 = q.m_data[1];
      puVar5 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,2);
      local_258._0_4_ = SUB84(dVar1,0);
      uVar3 = (undefined4)local_258;
      local_258._4_4_ = (uint)((ulong)dVar1 >> 0x20);
      uVar2 = local_258._4_4_ ^ 0x80000000;
      local_258 = -dVar1;
      *puVar5 = uVar3;
      puVar5[1] = uVar2;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,0);
      dVar1 = q.m_data[2];
      *pdVar6 = local_258;
      puVar5 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,3);
      local_258._0_4_ = SUB84(dVar1,0);
      uVar3 = (undefined4)local_258;
      local_258._4_4_ = (uint)((ulong)dVar1 >> 0x20);
      uVar2 = local_258._4_4_ ^ 0x80000000;
      local_258 = -dVar1;
      *puVar5 = uVar3;
      puVar5[1] = uVar2;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,0);
      dVar1 = q.m_data[3];
      *pdVar6 = local_258;
      puVar5 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,1);
      local_258._0_4_ = SUB84(dVar1,0);
      uVar3 = (undefined4)local_258;
      local_258._4_4_ = (uint)((ulong)dVar1 >> 0x20);
      uVar2 = local_258._4_4_ ^ 0x80000000;
      local_258 = -dVar1;
      *puVar5 = uVar3;
      puVar5[1] = uVar2;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,0);
      *pdVar6 = local_258;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,2);
      *pdVar6 = q.m_data[3];
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,1);
      *pdVar6 = q.m_data[2];
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,3);
      *pdVar6 = q.m_data[1];
      puVar5 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,3);
      local_258._0_4_ = SUB84(q.m_data[0],0);
      uVar3 = (undefined4)local_258;
      local_258._4_4_ = (uint)((ulong)q.m_data[0] >> 0x20);
      uVar2 = local_258._4_4_ ^ 0x80000000;
      local_258 = -q.m_data[0];
      *puVar5 = uVar3;
      puVar5[1] = uVar2;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,2);
      *pdVar6 = local_258;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dfq_by_dangvel,1);
      *pdVar6 = local_258;
      dfgyrobias_by_dgyrobias.m_data[0] = (this->m_params_qekf).time_step_in_seconds * 0.5;
      toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              &dfangvel_by_dgyrobias,&dfq_by_dangvel);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&dfangvel_by_dgyrobias,dfgyrobias_by_dgyrobias.m_data);
      pMVar9 = &this->m_Id3;
      pDVar10 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&dfangvel_by_dgyrobias;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(double *)pDVar10 = pMVar9->m_data[0];
        pMVar9 = (Matrix3x3 *)((long)pMVar9 + (ulong)bVar12 * -0x10 + 8);
        pDVar10 = pDVar10 + (ulong)bVar12 * -0x10 + 8;
      }
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = (PointerType)0xbff0000000000000;
      dfgyrobias_by_dgyrobias.m_data[0] = (double)&dfangvel_by_dgyrobias;
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
      operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&dfgyrobias_by_dgyrobias,(Scalar *)&local_158);
      pMVar9 = &this->m_Id3;
      pDVar11 = (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&dfgyrobias_by_dgyrobias;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(double *)pDVar11 = pMVar9->m_data[0];
        pMVar9 = (Matrix3x3 *)((long)pMVar9 + (ulong)bVar12 * -0x10 + 8);
        pDVar11 = pDVar11 + (ulong)bVar12 * -0x10 + 8;
      }
      local_248.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)
                (1.0 - (this->m_params_qekf).bias_correlation_time_factor *
                       (this->m_params_qekf).time_step_in_seconds);
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = (PointerType)&dfgyrobias_by_dgyrobias;
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
      operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_158,(Scalar *)&local_248);
      local_200.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dfq_by_dq.m_data;
      toEigen(&local_248,F);
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startRow.m_value = 0;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startCol.m_value = 0;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_outerStride =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,4,4,false>,Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_4,_false>
                  *)&local_158,
                 (Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> *)&local_200);
      toEigen(&local_248,&dfq_by_dangvel);
      toEigen(&local_200,F);
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = (PointerType)
                &(((BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
                    *)local_200.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data)->
                 super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
                 ).m_xpr.field_0x10;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_200.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_200.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_200.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startRow.m_value = 0;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startCol.m_value = 4;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_outerStride =
           local_200.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,4,3,false>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_3,_false>
                  *)&local_158,&local_248);
      local_200.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)&dfangvel_by_dgyrobias;
      toEigen(&local_248,F);
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data + local_248.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value * 4 + 7;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startRow.m_value = 4;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startCol.m_value = 7;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_outerStride =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
                (&local_158,
                 (Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)&local_200);
      local_200.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)&dfgyrobias_by_dgyrobias;
      toEigen(&local_248,F);
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data + local_248.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value * 7 + 7;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startRow.m_value = 7;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_startCol.m_value = 7;
      local_158.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
      .m_outerStride =
           local_248.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
                (&local_158,
                 (Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)&local_200);
      iDynTree::MatrixDynSize::~MatrixDynSize(&dfq_by_dangvel);
      return true;
    }
    pcVar8 = "jacobian matrix size mismatch";
  }
  else {
    pcVar8 = "state size mismatch";
  }
  iDynTree::reportError("AttitudeQuaternionEKF","computejacobianF",pcVar8);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& F)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "state size mismatch");
        return false;
    }

    if (F.rows() != m_state_size || F.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "jacobian matrix size mismatch");
        return false;
    }

    F.zero();

    iDynTree::UnitQuaternion q;
    iDynTree::Vector3 ang_vel, gyro_bias;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);
    toEigen(ang_vel) = toEigen(x).block<3,1>(4, 0);
    toEigen(gyro_bias) = toEigen(x).block<3,1>(7, 0);

    iDynTree::Matrix4x4 dfq_by_dq;
    dfq_by_dq(0,0) = dfq_by_dq(1, 1) = dfq_by_dq(2, 2) = dfq_by_dq(3, 3) = (2.0/m_params_qekf.time_step_in_seconds);
    dfq_by_dq(1, 0) = dfq_by_dq(2, 3) = ang_vel(0);
    dfq_by_dq(2, 0) = dfq_by_dq(3, 1) = ang_vel(1);
    dfq_by_dq(3, 0) = dfq_by_dq(1, 2) = ang_vel(2);
    dfq_by_dq(0, 1) = dfq_by_dq(3, 2) = -ang_vel(0);
    dfq_by_dq(0, 2) = dfq_by_dq(1, 3) = -ang_vel(1);
    dfq_by_dq(0, 3) = dfq_by_dq(2, 1) = -ang_vel(2);
    toEigen(dfq_by_dq) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::MatrixDynSize dfq_by_dangvel;
    dfq_by_dangvel.resize(4, 3);
    dfq_by_dangvel(0, 0) = dfq_by_dangvel(2, 2) = -q(1);
    dfq_by_dangvel(0, 1) = dfq_by_dangvel(3, 0) = -q(2);
    dfq_by_dangvel(0, 2) = dfq_by_dangvel(1, 1) = -q(3);
    dfq_by_dangvel(2, 0) = q(3);
    dfq_by_dangvel(1, 2) = q(2);
    dfq_by_dangvel(3, 1) = q(1);
    dfq_by_dangvel(1, 0) = dfq_by_dangvel(2, 1) = dfq_by_dangvel(3, 2) = -q(0);
    toEigen(dfq_by_dangvel) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::Matrix3x3 dfangvel_by_dgyrobias(m_Id3);
    toEigen(dfangvel_by_dgyrobias) *= -1;

    iDynTree::Matrix3x3 dfgyrobias_by_dgyrobias(m_Id3);
    toEigen(dfgyrobias_by_dgyrobias) *= (1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    toEigen(F).block<4,4>(0,0) = toEigen(dfq_by_dq);
    toEigen(F).block<4,3>(0,4) = toEigen(dfq_by_dangvel);
    toEigen(F).block<3,3>(4,7) = toEigen(dfangvel_by_dgyrobias);
    toEigen(F).block<3,3>(7,7) = toEigen(dfgyrobias_by_dgyrobias);

    return true;
}